

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void __thiscall
capnp::_::TestCapDestructor::TestCapDestructor
          (TestCapDestructor *this,Own<kj::PromiseFulfiller<void>_> *fulfiller)

{
  PromiseFulfiller<void> *pPVar1;
  
  *(undefined8 *)&this->field_0x48 = 0;
  (this->super_Server)._vptr_Server = (_func_int **)0x609d60;
  *(undefined8 *)&this->field_0x40 = 0x609d98;
  pPVar1 = fulfiller->ptr;
  *(Disposer **)&(this->super_Server).field_0x8 = fulfiller->disposer;
  *(PromiseFulfiller<void> **)&(this->super_Server).field_0x10 = pPVar1;
  fulfiller->ptr = (PromiseFulfiller<void> *)0x0;
  this->dummy = 0;
  TestInterfaceImpl::TestInterfaceImpl(&this->impl,&this->dummy);
  return;
}

Assistant:

TestCapDestructor(kj::Own<kj::PromiseFulfiller<void>>&& fulfiller)
      : fulfiller(kj::mv(fulfiller)), impl(dummy) {}